

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_main.cpp
# Opt level: O2

void D_AddConfigWads(TArray<FString,_FString> *wadfiles,char *section)

{
  bool bVar1;
  int iVar2;
  char *value;
  char *key;
  Position pos;
  FString local_60;
  TArray<FString,_FString> *local_58;
  char *local_50;
  char *local_48;
  Position local_40;
  
  local_58 = wadfiles;
  bVar1 = FConfigFile::SetSection(&GameConfig->super_FConfigFile,section,false);
  if (bVar1) {
    while( true ) {
      bVar1 = FConfigFile::NextInSection(&GameConfig->super_FConfigFile,&local_48,&local_50);
      if (!bVar1) break;
      iVar2 = strcasecmp(local_48,"Path");
      if (iVar2 == 0) {
        FConfigFile::GetPosition(&GameConfig->super_FConfigFile,&local_40);
        ExpandEnvVars((char *)&local_60);
        D_AddWildFile(local_58,local_60.Chars);
        FString::~FString(&local_60);
        FConfigFile::SetPosition(&GameConfig->super_FConfigFile,&local_40);
      }
    }
  }
  return;
}

Assistant:

void D_AddConfigWads (TArray<FString> &wadfiles, const char *section)
{
	if (GameConfig->SetSection (section))
	{
		const char *key;
		const char *value;
		FConfigFile::Position pos;

		while (GameConfig->NextInSection (key, value))
		{
			if (stricmp (key, "Path") == 0)
			{
				// D_AddWildFile resets GameConfig's position, so remember it
				GameConfig->GetPosition (pos);
				D_AddWildFile (wadfiles, ExpandEnvVars(value));
				// Reset GameConfig's position to get next wad
				GameConfig->SetPosition (pos);
			}
		}
	}
}